

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQuerySpecification.cpp
# Opt level: O3

void __thiscall
DIS::RecordQuerySpecification::~RecordQuerySpecification(RecordQuerySpecification *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pFVar3;
  
  this->_vptr_RecordQuerySpecification = (_func_int **)&PTR__RecordQuerySpecification_001b5aa0;
  pFVar1 = (this->_records).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_records).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar3 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar3->_vptr_FourByteChunk)(pFVar3);
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2);
    (this->_records).super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::~vector(&this->_records);
  return;
}

Assistant:

RecordQuerySpecification::~RecordQuerySpecification()
{
    _records.clear();
}